

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O2

bool google::protobuf::compiler::cpp::HasRepeatedFields(Descriptor *descriptor)

{
  int *piVar1;
  uint uVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  uVar4 = (ulong)*(uint *)(descriptor + 0x68);
  if ((int)*(uint *)(descriptor + 0x68) < 1) {
    uVar4 = 0;
  }
  uVar5 = 0;
  while (uVar4 * 0x98 + 0x98 != uVar5 + 0x98) {
    piVar1 = (int *)(*(long *)(descriptor + 0x28) + 0x3c + uVar5);
    uVar5 = uVar5 + 0x98;
    if (*piVar1 == 3) {
      return true;
    }
  }
  uVar2 = *(uint *)(descriptor + 0x70);
  lVar6 = 0;
  uVar4 = 0;
  if (0 < (int)uVar2) {
    uVar4 = (ulong)uVar2;
  }
  uVar5 = 0;
  do {
    if (uVar4 == uVar5) {
      return (long)uVar5 < (long)(int)uVar2;
    }
    bVar3 = HasRepeatedFields((Descriptor *)(*(long *)(descriptor + 0x38) + lVar6));
    uVar5 = uVar5 + 1;
    lVar6 = lVar6 + 0x90;
  } while (!bVar3);
  return true;
}

Assistant:

static bool HasRepeatedFields(const Descriptor* descriptor) {
  for (int i = 0; i < descriptor->field_count(); ++i) {
    if (descriptor->field(i)->label() == FieldDescriptor::LABEL_REPEATED) {
      return true;
    }
  }
  for (int i = 0; i < descriptor->nested_type_count(); ++i) {
    if (HasRepeatedFields(descriptor->nested_type(i))) return true;
  }
  return false;
}